

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.cpp
# Opt level: O0

CScript * GetScriptForDestination(CTxDestination *dest)

{
  long lVar1;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_RDI;
  long in_FS_OFFSET;
  CScriptVisitor *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  visit<(anonymous_namespace)::CScriptVisitor,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>const&>
            (in_stack_fffffffffffffff0,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CScript *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CScript GetScriptForDestination(const CTxDestination& dest)
{
    return std::visit(CScriptVisitor(), dest);
}